

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZDICT_trainFromBuffer_fastCover
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples,ZDICT_fastCover_params_t parameters)

{
  ZDICT_cover_params_t parameters_00;
  ZDICT_params_t params;
  int iVar1;
  U16 *segmentFreqs;
  size_t sVar2;
  uint f;
  uint d;
  undefined1 auVar3 [16];
  FASTCOVER_ctx_t ctx;
  ZDICT_params_t local_98;
  FASTCOVER_ctx_t local_80;
  
  g_displayLevel = parameters.zParams.notificationLevel;
  f = 0x14;
  if (parameters.f != 0) {
    f = parameters.f;
  }
  local_98 = parameters.zParams;
  params = local_98;
  auVar3._0_4_ = -(uint)(parameters.k == 0);
  d = parameters.d;
  auVar3._4_4_ = -(uint)(d == 0);
  auVar3._8_4_ = 0xffffffff;
  auVar3._12_4_ = 0xffffffff;
  auVar3 = pmovsxdq(auVar3,auVar3);
  iVar1 = movmskpd(parameters.zParams.dictID,auVar3);
  if ((iVar1 == 0) &&
     (((d == 8 || (d == 6)) &&
      (parameters.accel < 0xb &&
       ((0xffffffe0 < f - 0x20 && (parameters._0_8_ & 0xffffffff) <= dictBufferCapacity) &&
       d <= parameters.k))))) {
    if (nbSamples == 0) {
      sVar2 = 0xffffffffffffffb8;
      if (0 < (int)parameters.zParams.notificationLevel) {
        ZDICT_trainFromBuffer_fastCover_cold_5();
      }
    }
    else if (dictBufferCapacity < 0x100) {
      sVar2 = 0xffffffffffffffba;
      if (0 < (int)parameters.zParams.notificationLevel) {
        ZDICT_trainFromBuffer_fastCover_cold_4();
      }
    }
    else {
      sVar2 = FASTCOVER_ctx_init(&local_80,samplesBuffer,samplesSizes,nbSamples,d,1.0,f,
                                 FASTCOVER_defaultAccelParameters
                                 [parameters.accel + (parameters.accel == 0)]);
      if (sVar2 < 0xffffffffffffff89) {
        COVER_warnOnSmallCorpus(dictBufferCapacity,local_80.nbDmers,g_displayLevel);
        if (1 < g_displayLevel) {
          ZDICT_trainFromBuffer_fastCover_cold_2();
        }
        segmentFreqs = (U16 *)calloc(1L << ((byte)f & 0x3f),2);
        local_98._0_8_ = parameters.zParams._0_8_;
        parameters_00.steps = parameters.steps;
        parameters_00.nbThreads = parameters.nbThreads;
        parameters_00.k = parameters.k;
        parameters_00.d = parameters.d;
        parameters_00.splitPoint._0_4_ = 0;
        parameters_00.splitPoint._4_4_ = 0x3ff00000;
        parameters_00.shrinkDict = parameters.shrinkDict;
        parameters_00.shrinkDictMaxRegression = 0;
        parameters_00.zParams.compressionLevel = local_98.compressionLevel;
        parameters_00.zParams.notificationLevel = local_98.notificationLevel;
        parameters_00.zParams.dictID = parameters.zParams.dictID;
        parameters_00._44_4_ = 0;
        sVar2 = FASTCOVER_buildDictionary
                          (&local_80,local_80.freqs,dictBuffer,dictBufferCapacity,parameters_00,
                           segmentFreqs);
        sVar2 = ZDICT_finalizeDictionary
                          (dictBuffer,dictBufferCapacity,(void *)((long)dictBuffer + sVar2),
                           dictBufferCapacity - sVar2,samplesBuffer,samplesSizes,
                           (uint)((local_80.accelParams.finalize * local_80.nbTrainSamples) / 100),
                           params);
        if ((sVar2 < 0xffffffffffffff89) && (1 < g_displayLevel)) {
          ZDICT_trainFromBuffer_fastCover_cold_3();
        }
        free(local_80.freqs);
        local_80.freqs = (U32 *)0x0;
        free(local_80.offsets);
        local_80.offsets = (size_t *)0x0;
        free(segmentFreqs);
      }
      else if (0 < g_displayLevel) {
        ZDICT_trainFromBuffer_fastCover_cold_1();
      }
    }
  }
  else {
    sVar2 = 0xffffffffffffffd6;
    if (0 < (int)parameters.zParams.notificationLevel) {
      ZDICT_trainFromBuffer_fastCover_cold_6();
    }
  }
  return sVar2;
}

Assistant:

ZDICTLIB_API size_t
ZDICT_trainFromBuffer_fastCover(void* dictBuffer, size_t dictBufferCapacity,
                                const void* samplesBuffer,
                                const size_t* samplesSizes, unsigned nbSamples,
                                ZDICT_fastCover_params_t parameters)
{
    BYTE* const dict = (BYTE*)dictBuffer;
    FASTCOVER_ctx_t ctx;
    ZDICT_cover_params_t coverParams;
    FASTCOVER_accel_t accelParams;
    /* Initialize global data */
    g_displayLevel = (int)parameters.zParams.notificationLevel;
    /* Assign splitPoint and f if not provided */
    parameters.splitPoint = 1.0;
    parameters.f = parameters.f == 0 ? DEFAULT_F : parameters.f;
    parameters.accel = parameters.accel == 0 ? DEFAULT_ACCEL : parameters.accel;
    /* Convert to cover parameter */
    memset(&coverParams, 0 , sizeof(coverParams));
    FASTCOVER_convertToCoverParams(parameters, &coverParams);
    /* Checks */
    if (!FASTCOVER_checkParameters(coverParams, dictBufferCapacity, parameters.f,
                                   parameters.accel)) {
      DISPLAYLEVEL(1, "FASTCOVER parameters incorrect\n");
      return ERROR(parameter_outOfBound);
    }
    if (nbSamples == 0) {
      DISPLAYLEVEL(1, "FASTCOVER must have at least one input file\n");
      return ERROR(srcSize_wrong);
    }
    if (dictBufferCapacity < ZDICT_DICTSIZE_MIN) {
      DISPLAYLEVEL(1, "dictBufferCapacity must be at least %u\n",
                   ZDICT_DICTSIZE_MIN);
      return ERROR(dstSize_tooSmall);
    }
    /* Assign corresponding FASTCOVER_accel_t to accelParams*/
    accelParams = FASTCOVER_defaultAccelParameters[parameters.accel];
    /* Initialize context */
    {
      size_t const initVal = FASTCOVER_ctx_init(&ctx, samplesBuffer, samplesSizes, nbSamples,
                            coverParams.d, parameters.splitPoint, parameters.f,
                            accelParams);
      if (ZSTD_isError(initVal)) {
        DISPLAYLEVEL(1, "Failed to initialize context\n");
        return initVal;
      }
    }
    COVER_warnOnSmallCorpus(dictBufferCapacity, ctx.nbDmers, g_displayLevel);
    /* Build the dictionary */
    DISPLAYLEVEL(2, "Building dictionary\n");
    {
      /* Initialize array to keep track of frequency of dmer within activeSegment */
      U16* segmentFreqs = (U16 *)calloc(((U64)1 << parameters.f), sizeof(U16));
      const size_t tail = FASTCOVER_buildDictionary(&ctx, ctx.freqs, dictBuffer,
                                                dictBufferCapacity, coverParams, segmentFreqs);
      const unsigned nbFinalizeSamples = (unsigned)(ctx.nbTrainSamples * ctx.accelParams.finalize / 100);
      const size_t dictionarySize = ZDICT_finalizeDictionary(
          dict, dictBufferCapacity, dict + tail, dictBufferCapacity - tail,
          samplesBuffer, samplesSizes, nbFinalizeSamples, coverParams.zParams);
      if (!ZSTD_isError(dictionarySize)) {
          DISPLAYLEVEL(2, "Constructed dictionary of size %u\n",
                      (unsigned)dictionarySize);
      }
      FASTCOVER_ctx_destroy(&ctx);
      free(segmentFreqs);
      return dictionarySize;
    }
}